

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draw.cpp
# Opt level: O0

Shader * vera::getFillShader(void)

{
  Shader *this;
  DefaultShaders _type;
  DefaultShaders _type_00;
  string local_58;
  string local_38;
  
  if (fill_shader == (Shader *)0x0) {
    this = (Shader *)operator_new(0x100);
    Shader::Shader(this);
    fill_shader = this;
    getDefaultSrc_abi_cxx11_(&local_38,(vera *)0xf,_type);
    getDefaultSrc_abi_cxx11_(&local_58,(vera *)0xe,_type_00);
    Shader::setSource(this,&local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return fill_shader;
}

Assistant:

Shader* getFillShader() {
    if (fill_shader == nullptr) {
        fill_shader = new Shader();
        fill_shader->setSource( getDefaultSrc(FRAG_FILL), getDefaultSrc(VERT_FILL) );
    }
    
    return fill_shader;
}